

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O2

SRes SzReadAndDecodePackedStreams
               (ILookInStream *inStream,CSzData *sd,CBuf *tempBufs,UInt32 numFoldersMax,
               UInt64 baseOffset,CSzAr *p,ISzAlloc *allocTemp)

{
  undefined8 *puVar1;
  SRes SVar2;
  int iVar3;
  long lVar4;
  ISzAlloc *alloc;
  UInt64 startPos;
  ulong uVar5;
  CBuf *p_00;
  ulong uVar6;
  size_t *psVar7;
  CSubStreamInfo *ssi_00;
  ISzAlloc *in_stack_ffffffffffffff70;
  UInt64 local_78;
  UInt64 local_70;
  CSubStreamInfo ssi;
  
  local_78 = 0;
  ssi_00 = &ssi;
  SVar2 = SzReadStreamsInfo(p,sd,numFoldersMax,(CBuf *)0x0,0,&local_78,ssi_00,
                            in_stack_ffffffffffffff70);
  if (SVar2 != 0) {
    return SVar2;
  }
  uVar6 = (ulong)p->NumFolders;
  if (uVar6 != 0) {
    if (numFoldersMax < p->NumFolders) {
      return 4;
    }
    startPos = baseOffset + local_78;
    for (lVar4 = 0; uVar6 << 4 != lVar4; lVar4 = lVar4 + 0x10) {
      puVar1 = (undefined8 *)((long)&tempBufs->data + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
    uVar5 = 0;
    p_00 = tempBufs;
    do {
      if (uVar6 == uVar5) {
        psVar7 = &tempBufs->size;
        uVar5 = 0;
        while( true ) {
          if (uVar6 == uVar5) {
            return 0;
          }
          local_70 = startPos;
          SVar2 = (*inStream->Seek)(inStream,(Int64 *)&local_70,SZ_SEEK_SET);
          if (SVar2 != 0) break;
          SVar2 = SzAr_DecodeFolder(p,(UInt32)uVar5,inStream,startPos,((CBuf *)(psVar7 + -1))->data,
                                    *psVar7,(ISzAlloc *)ssi_00);
          uVar5 = uVar5 + 1;
          psVar7 = psVar7 + 2;
          if (SVar2 != 0) {
            return SVar2;
          }
        }
        return SVar2;
      }
      alloc = (ISzAlloc *)
              (ulong)((uint)p->FoToMainUnpackSizeIndex[uVar5] + p->FoToCoderUnpackSizes[uVar5]);
      iVar3 = Buf_Create(p_00,p->CoderUnpackSizes[(long)alloc],alloc);
      uVar5 = uVar5 + 1;
      p_00 = p_00 + 1;
    } while (iVar3 != 0);
    return 2;
  }
  return 0x10;
}

Assistant:

static SRes SzReadAndDecodePackedStreams(
    ILookInStream *inStream,
    CSzData *sd,
    CBuf *tempBufs,
    UInt32 numFoldersMax,
    UInt64 baseOffset,
    CSzAr *p,
    ISzAlloc *allocTemp)
{
  UInt64 dataStartPos = 0;
  UInt32 fo;
  CSubStreamInfo ssi;
  UInt32 numFolders;

  RINOK(SzReadStreamsInfo(p, sd, numFoldersMax, NULL, 0, &dataStartPos, &ssi, allocTemp));

  numFolders = p->NumFolders;
  if (numFolders == 0)
    return SZ_ERROR_ARCHIVE;
  else if (numFolders > numFoldersMax)
    return SZ_ERROR_UNSUPPORTED;

  dataStartPos += baseOffset;

  for (fo = 0; fo < numFolders; fo++)
    Buf_Init(tempBufs + fo);
  
  for (fo = 0; fo < numFolders; fo++)
  {
    CBuf *tempBuf = tempBufs + fo;
    UInt64 unpackSize = SzAr_GetFolderUnpackSize(p, fo);
    if ((size_t)unpackSize != unpackSize)
      return SZ_ERROR_MEM;
    if (!Buf_Create(tempBuf, (size_t)unpackSize, allocTemp))
      return SZ_ERROR_MEM;
  }
  
  for (fo = 0; fo < numFolders; fo++)
  {
    const CBuf *tempBuf = tempBufs + fo;
    RINOK(LookInStream_SeekTo(inStream, dataStartPos));
    RINOK(SzAr_DecodeFolder(p, fo, inStream, dataStartPos, tempBuf->data, tempBuf->size, allocTemp));
  }
  
  return SZ_OK;
}